

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_add_range_closed_combinatoric_64(void **param_1)

{
  uint64_t expected_cardinality;
  uint64_t last_bucket;
  uint64_t first_bucket;
  uint64_t value;
  uint32_t slot;
  uint32_t bit_index;
  Roaring64Map roaring;
  uint32_t bitmask;
  uint32_t bitmask_limit;
  uint32_t base_slot;
  uint32_t num_slots_to_test;
  int line;
  Roaring64Map *in_stack_ffffffffffffff70;
  uint64_t in_stack_ffffffffffffff78;
  Roaring64Map *in_stack_ffffffffffffff80;
  Roaring64Map *in_stack_ffffffffffffffa0;
  undefined4 local_54;
  uint64_t in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffc8;
  Roaring64Map *in_stack_ffffffffffffffd0;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
    ::roaring::Roaring64Map::Roaring64Map(in_stack_ffffffffffffff70);
    for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
      if ((local_18 & 1 << ((byte)local_54 & 0x1f)) != 0) {
        in_stack_ffffffffffffffa0 = (Roaring64Map *)CONCAT44(local_54 + 0x32,local_54);
        ::roaring::Roaring64Map::add(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
    in_stack_ffffffffffffff80 = (Roaring64Map *)0x3600000000;
    ::roaring::Roaring64Map::addRangeClosed
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffff78 = 0x500000000;
    line = 5;
    in_stack_ffffffffffffff70 =
         (Roaring64Map *)::roaring::Roaring64Map::cardinality(in_stack_ffffffffffffffa0);
    _assert_int_equal((unsigned_long)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                      (char *)in_stack_ffffffffffffff70,line);
    ::roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10ab96);
  }
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_range_closed_combinatoric_64) {
    // Given 'num_slots_to_test' outer slots, we repeatedly seed a Roaring64Map
    // with all combinations of present and absent outer slots (basically the
    // powerset of {0...num_slots_to_test - 1}), then we add_range_closed
    // and see if the cardinality is what we expect.
    //
    // For example (assuming num_slots_to_test = 5), the iterations of the outer
    // loop represent these sets:
    // 1. {}
    // 2. {0}
    // 3. {1}
    // 4. {0, 1}
    // 5. {2}
    // 6. {0, 2}
    // 7. {1, 2}
    // 8. {0, 1, 2}
    // 9. {3}
    // and so forth...
    //
    // For example, in step 6 (representing set {0, 2}) we set a bit somewhere
    // in slot 0 and we set another bit somehwere in slot 2. The purpose of this
    // is to make sure 'addRangeClosed' does the right thing when it encounters
    // an arbitrary mix of present and absent slots. Then we call
    // 'addRangeClosed' over the whole range and confirm that the cardinality
    // is what we expect.
    const uint32_t num_slots_to_test = 5;
    const uint32_t base_slot = 50;

    const uint32_t bitmask_limit = 1 << num_slots_to_test;

    for (uint32_t bitmask = 0; bitmask < bitmask_limit; ++bitmask) {
        Roaring64Map roaring;

        // The 1-bits in 'bitmask' indicate which slots we want to seed
        // with a value.
        for (uint32_t bit_index = 0; bit_index < num_slots_to_test;
             ++bit_index) {
            if ((bitmask & (1 << bit_index)) == 0) {
                continue;
            }
            auto slot = base_slot + bit_index;
            auto value = (uint64_t(slot) << 32) + bit_index;
            roaring.add(value);
        }

        auto first_bucket = uint64_t(base_slot) << 32;
        auto last_bucket = uint64_t(base_slot + num_slots_to_test - 1) << 32;

        roaring.addRangeClosed(first_bucket, last_bucket + uint32_max);

        auto expected_cardinality = num_slots_to_test * (uint64_t(1) << 32);
        assert_int_equal(expected_cardinality, roaring.cardinality());
    }
}